

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O3

int quote_fname(char *file)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  byte *pbVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  byte *pbVar11;
  bool bVar12;
  char ver_buf [16];
  char ver [16];
  char namebuf [256];
  char fbuf [256];
  char local_258 [16];
  char local_248 [16];
  char local_238 [256];
  byte local_138 [264];
  
  pcVar8 = local_258;
  pbVar3 = local_138;
  pbVar7 = (byte *)file;
  do {
    bVar1 = *pbVar7;
    lVar10 = 1;
    pbVar11 = pbVar3;
    if (bVar1 < 0x3b) {
      if (bVar1 == 0x27) goto LAB_0013702b;
      if (bVar1 == 0) goto code_r0x00137049;
    }
    else if ((bVar1 == 0x3e) || (bVar1 == 0x3b)) {
LAB_0013702b:
      *pbVar3 = 0x27;
      lVar10 = 2;
      pbVar11 = pbVar3 + 1;
    }
    pbVar3 = pbVar3 + lVar10;
    *pbVar11 = bVar1;
    pbVar7 = pbVar7 + 1;
  } while( true );
  while (local_258[0] = *pcVar8, local_258[0] != '\0') {
LAB_001371a4:
    pcVar8 = pcVar8 + 1;
    if ((byte)(local_258[0] - 0x3aU) < 0xf6) goto LAB_001371f0;
  }
  pcVar5[-1] = ';';
  pcVar5[0] = '\0';
  *pcVar9 = '\0';
  uVar6 = strtoul(pcVar5 + 1,(char **)0x0,10);
  sprintf(local_258,"%u",uVar6 & 0xffffffff);
  strcat(local_238,local_258);
  goto LAB_001371f0;
code_r0x00137049:
  *pbVar3 = 0;
  pbVar3 = local_138;
  separate_version((char *)pbVar3,local_248,1);
  if (local_138[0] == 0) {
LAB_001370af:
    if (pbVar3[-1] == 0x2e) {
      pbVar3[-1] = 0x27;
      pbVar3[0] = 0x2e;
      pbVar3 = pbVar3 + 1;
    }
    pbVar3[0] = 0x2e;
    pbVar3[1] = 0;
  }
  else {
    pbVar7 = local_138;
    do {
      pbVar3 = pbVar7 + 1;
      bVar12 = true;
      if (local_138[0] == 0x27) {
        if (pbVar7[1] != 0) {
          pbVar3 = pbVar7 + 2;
        }
      }
      else if (local_138[0] == 0x2e) {
        bVar12 = *pbVar3 == 0;
      }
      local_138[0] = *pbVar3;
    } while ((local_138[0] != 0) && (pbVar7 = pbVar3, bVar12));
    if (bVar12) goto LAB_001370af;
  }
  strcpy(local_238,(char *)local_138);
  if (local_248[0] != '\0') {
    sVar4 = strlen(local_238);
    (local_238 + sVar4)[0] = '.';
    (local_238 + sVar4)[1] = '~';
    local_238[sVar4 + 2] = '\0';
    strcat(local_238,local_248);
    sVar4 = strlen(local_238);
    (local_238 + sVar4)[0] = '~';
    (local_238 + sVar4)[1] = '\0';
  }
  pcVar5 = strchr(local_238,0x7e);
  pcVar2 = pcVar5;
  if (pcVar5 != (char *)0x0) {
    do {
      pcVar9 = pcVar2;
      lVar10 = 1;
      while( true ) {
        if (pcVar9[lVar10] == '\0') {
          if ((pcVar5 == pcVar9) || (lVar10 != 1 || pcVar5[-1] != '.')) goto LAB_001371f0;
          strncpy(local_258,pcVar5 + 1,(size_t)(pcVar9 + ~(ulong)pcVar5));
          local_258[(long)(pcVar9 + ~(ulong)pcVar5)] = '\0';
          if (local_258[0] == '\0') goto LAB_001371f0;
          goto LAB_001371a4;
        }
        if (pcVar9[lVar10] == '~') break;
        lVar10 = lVar10 + 1;
      }
      pcVar2 = pcVar9 + lVar10;
      pcVar5 = pcVar9;
    } while( true );
  }
LAB_001371f0:
  strcpy(file,local_238);
  return 1;
}

Assistant:

int quote_fname(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1], namebuf[MAXNAMLEN + 1], ver[VERSIONLEN];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  separate_version(fbuf, ver, 1);
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  if (*ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }
  UnixVersionToLispVersion(namebuf, 1);
  strcpy(file, namebuf);
  return (1);
}